

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_ClearNoResize_Test
          (HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  void *in_RDI;
  
  ~HashtableAllTest_ClearNoResize_Test
            ((HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)0xbac878);
  operator_delete(in_RDI);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ClearNoResize) {
  if (!this->ht_.supports_clear_no_resize()) return;
  typename TypeParam::size_type empty_bucket_count = this->ht_.bucket_count();
  int last_element = 1;
  while (this->ht_.bucket_count() == empty_bucket_count) {
    this->ht_.insert(this->UniqueObject(last_element));
    ++last_element;
  }
  typename TypeParam::size_type last_bucket_count = this->ht_.bucket_count();
  this->ht_.clear_no_resize();
  EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  EXPECT_TRUE(this->ht_.empty());

  // When inserting the same number of elements again, no resize
  // should be necessary.
  for (int i = 1; i < last_element; ++i) {
    this->ht_.insert(this->UniqueObject(last_element + i));
    EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  }
}